

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CS248::Application::keyboard_event(Application *this,int key,int event,uchar mods)

{
  Timeline *pTVar1;
  char cVar2;
  SceneObject *pSVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  Mesh *pMVar9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  mapped_type *pmVar12;
  Scene *pSVar13;
  _Rb_tree_header *p_Var14;
  undefined4 uVar15;
  undefined4 uVar16;
  double local_68;
  double dStack_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar8 = *(int *)&(this->super_Renderer).field_0xc;
  if (iVar8 == 0) {
    if (key == 0x102) {
      if (event == 1) {
        this->show_hud = (bool)(this->show_hud ^ 1);
        goto LAB_0018c1c2;
      }
    }
    else if (((key == 0x105) || (key == 0x103)) && (event == 1)) {
      DynamicScene::Scene::erase_selected_element(this->scene);
      goto LAB_0018c1c2;
    }
  }
  else if (iVar8 == 2) {
    if (key < 0x102) {
      switch(key) {
      case 0x3d:
        if ((event != 1 & (byte)((mods & 4) >> 2)) == 0) {
          if ((mods & 1) == 0) {
            this->timestep = this->timestep + 0.01;
          }
          else {
            dVar6 = this->damping_factor + 0.001;
            this->damping_factor = dVar6;
            if (1.0 < dVar6) {
              this->damping_factor = 1.0;
            }
          }
        }
        break;
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x45:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4d:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x56:
      case 0x58:
      case 0x59:
        break;
      case 0x44:
        if (event == 1) {
          this->action = BoneRadius;
          goto LAB_0018c1c2;
        }
        break;
      case 0x46:
        if (event == 1) {
          this->integrator = Forward_Euler;
          goto LAB_0018c1c2;
        }
        break;
      case 0x49:
        if (event == 1) {
          this->action = IK;
          std::
          _Rb_tree<CS248::DynamicScene::Joint_*,_std::pair<CS248::DynamicScene::Joint_*const,_CS248::Vector3D>,_std::_Select1st<std::pair<CS248::DynamicScene::Joint_*const,_CS248::Vector3D>_>,_std::less<CS248::DynamicScene::Joint_*>,_std::allocator<std::pair<CS248::DynamicScene::Joint_*const,_CS248::Vector3D>_>_>
          ::clear(&(this->ikTargets)._M_t);
          goto LAB_0018c1c2;
        }
        break;
      case 0x4b:
        if (event == 1) {
          pSVar13 = this->scene;
          if (mods == '\0') {
            pSVar3 = (pSVar13->selected).object;
            if ((pSVar3 != (SceneObject *)0x0) &&
               (pMVar9 = (Mesh *)__dynamic_cast(pSVar3,&DynamicScene::SceneObject::typeinfo,
                                                &DynamicScene::Mesh::typeinfo,0),
               pMVar9 != (Mesh *)0x0)) {
              pTVar1 = &this->timeline;
              iVar8 = Timeline::getCurrentFrame(pTVar1);
              DynamicScene::Mesh::keyframe(pMVar9,(double)iVar8);
              iVar8 = Timeline::getCurrentFrame(pTVar1);
              Timeline::markTime(pTVar1,iVar8);
            }
            goto LAB_0018c1c2;
          }
          p_Var10 = (pSVar13->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var14 = &(pSVar13->objects)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var10 == p_Var14) goto LAB_0018c1c2;
          pTVar1 = &this->timeline;
          do {
            if ((*(long *)(p_Var10 + 1) != 0) &&
               (pMVar9 = (Mesh *)__dynamic_cast(*(long *)(p_Var10 + 1),
                                                &DynamicScene::SceneObject::typeinfo,
                                                &DynamicScene::Mesh::typeinfo,0),
               pMVar9 != (Mesh *)0x0)) {
              iVar8 = Timeline::getCurrentFrame(pTVar1);
              DynamicScene::Mesh::keyframe(pMVar9,(double)iVar8);
              iVar8 = Timeline::getCurrentFrame(pTVar1);
              Timeline::markTime(pTVar1,iVar8);
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var14);
        }
        break;
      case 0x4c:
        if (event == 1) {
          Timeline::action_loop(&this->timeline);
          goto LAB_0018c1c2;
        }
        break;
      case 0x4e:
        if (event == 1) {
          raytrace_video(this);
          goto LAB_0018c1c2;
        }
        break;
      case 0x4f:
        to_object_action(this);
        break;
      case 0x53:
        if (event == 1) {
          this->integrator = Symplectic_Euler;
          goto LAB_0018c1c2;
        }
        break;
      case 0x54:
        if (event == 1) {
          rasterize_video(this);
          goto LAB_0018c1c2;
        }
        break;
      case 0x55:
        if (event == 1) {
          this->useCapsuleRadius = (bool)(this->useCapsuleRadius ^ 1);
          goto LAB_0018c1c2;
        }
        break;
      case 0x57:
        to_wave_action(this);
        break;
      case 0x5a:
        pSVar13 = this->scene;
        for (p_Var11 = (pSVar13->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var11 != &(pSVar13->objects)._M_t._M_impl.super__Rb_tree_header;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          pMVar9 = *(Mesh **)(p_Var11 + 1);
          (*(pMVar9->super_SceneObject)._vptr_SceneObject[5])(&local_48,pMVar9);
          cVar2 = *((local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if (cVar2 == 'M') {
            DynamicScene::Mesh::resetWave(pMVar9);
          }
        }
        break;
      default:
        if (key == 0x20) {
          if (event == 1) {
            if (1 < this->action - Raytrace_Video) {
              pTVar1 = &this->timeline;
              bVar7 = Timeline::isCurrentlyPlaying(pTVar1);
              if (bVar7) {
                Timeline::action_stop(pTVar1);
              }
              else {
                Timeline::action_play(pTVar1);
                DynamicScene::Scene::removeObject
                          (this->scene,&this->scene->elementTransform->super_SceneObject);
              }
              bVar7 = Timeline::isCurrentlyPlaying(pTVar1);
              setGhosted(this,(bool)(~bVar7 & this->action != Wave));
            }
            goto LAB_0018c1c2;
          }
        }
        else if ((key == 0x2d) && ((event != 1 & (byte)((mods & 4) >> 2)) == 0)) {
          if ((mods & 1) == 0) {
            dVar6 = this->timestep + -0.01;
            this->timestep = dVar6;
            if (dVar6 < 1e-11) {
              this->timestep = 0.01;
            }
          }
          else {
            dVar6 = this->damping_factor + -0.001;
            this->damping_factor = dVar6;
            if (dVar6 < 0.0) {
              this->damping_factor = 0.0;
            }
          }
        }
      }
    }
    else {
      switch(key) {
      case 0x102:
        if ((event == 1) && (this->action == Object)) {
          DynamicScene::XFormWidget::cycleMode(this->scene->elementTransform);
          goto LAB_0018c1c2;
        }
        break;
      case 0x103:
      case 0x105:
        if (event == 1) {
          pTVar1 = &this->timeline;
          bVar7 = Timeline::isCurrentlyPlaying(pTVar1);
          if (bVar7) goto LAB_0018c1c2;
          if (mods == '\0') {
            if (this->action == CreateJoint) {
              DynamicScene::Scene::erase_selected_joint(this->scene);
              this->clickedJoint = (Joint *)0x0;
              goto LAB_0018c1c2;
            }
            if ((this->scene->selected).object == (SceneObject *)0x0) goto LAB_0018c1c2;
            iVar8 = Timeline::getCurrentFrame(pTVar1);
            pSVar13 = this->scene;
            pSVar3 = (pSVar13->selected).object;
            if ((pSVar3 != (SceneObject *)0x0) &&
               (pMVar9 = (Mesh *)__dynamic_cast(pSVar3,&DynamicScene::SceneObject::typeinfo,
                                                &DynamicScene::Mesh::typeinfo,0),
               pMVar9 != (Mesh *)0x0)) {
              DynamicScene::Mesh::unkeyframe(pMVar9,(double)iVar8);
              pSVar13 = this->scene;
            }
            for (p_Var11 = (pSVar13->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var11 != &(pSVar13->objects)._M_t._M_impl.super__Rb_tree_header
                ; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
              lVar4 = *(long *)(p_Var11 + 1);
              iVar8 = Timeline::getCurrentFrame(pTVar1);
              if (*(long *)(lVar4 + 0x80) == 0) {
                local_68 = 0.0;
                dStack_60 = 0.0;
                uVar15 = 0;
                uVar16 = 0;
              }
              else {
                lVar5 = *(long *)(lVar4 + 0x70);
                local_68 = *(double *)(lVar5 + 0x28);
                dStack_60 = *(double *)(lVar5 + 0x30);
                uVar15 = (undefined4)*(undefined8 *)(lVar5 + 0x38);
                uVar16 = (undefined4)((ulong)*(undefined8 *)(lVar5 + 0x38) >> 0x20);
              }
              bVar7 = Spline<CS248::Vector3D>::removeKnot
                                ((Spline<CS248::Vector3D> *)(lVar4 + 0x58),(double)iVar8,0.001);
              if (bVar7) {
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)(double)iVar8;
                pmVar12 = std::
                          map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
                          ::operator[]((map<double,_CS248::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CS248::Vector3D>_>_>
                                        *)(lVar4 + 0x58),(key_type *)&local_48);
                pmVar12->x = local_68;
                pmVar12->y = dStack_60;
                pmVar12->z = (double)CONCAT44(uVar16,uVar15);
                goto switchD_0018b9d2_caseD_3e;
              }
            }
            iVar8 = Timeline::getCurrentFrame(pTVar1);
            Timeline::unmarkTime(pTVar1,iVar8);
          }
          else {
            iVar8 = Timeline::getCurrentFrame(pTVar1);
            Timeline::unmarkTime(pTVar1,iVar8);
            p_Var10 = (this->scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var14 = &(this->scene->objects)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)p_Var10 == p_Var14) goto LAB_0018c1c2;
            do {
              if ((*(long *)(p_Var10 + 1) != 0) &&
                 (pMVar9 = (Mesh *)__dynamic_cast(*(long *)(p_Var10 + 1),
                                                  &DynamicScene::SceneObject::typeinfo,
                                                  &DynamicScene::Mesh::typeinfo,0),
                 pMVar9 != (Mesh *)0x0)) {
                iVar8 = Timeline::getCurrentFrame(pTVar1);
                DynamicScene::Mesh::unkeyframe(pMVar9,(double)iVar8);
              }
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            } while ((_Rb_tree_header *)p_Var10 != p_Var14);
          }
        }
        break;
      case 0x106:
        if (mods == '\x04') {
          if (event == 1) {
            Timeline::action_step_forward(&this->timeline,1);
            goto LAB_0018c1c2;
          }
        }
        else if (mods == '\x02') {
          Timeline::action_goto_end(&this->timeline);
        }
        else if (mods == '\x01') {
          if (event == 1) {
            Timeline::action_goto_next_key_frame(&this->timeline);
            goto LAB_0018c1c2;
          }
        }
        else {
          Timeline::action_step_forward(&this->timeline,1);
        }
        break;
      case 0x107:
        if (mods == '\x04') {
          if (event == 1) {
            Timeline::action_step_backward(&this->timeline,1);
            goto LAB_0018c1c2;
          }
        }
        else if (mods == '\x02') {
          Timeline::action_rewind(&this->timeline);
        }
        else if (mods == '\x01') {
          if (event == 1) {
            Timeline::action_goto_prev_key_frame(&this->timeline);
            goto LAB_0018c1c2;
          }
        }
        else {
          Timeline::action_step_backward(&this->timeline,1);
        }
        break;
      case 0x108:
        if (event == 1) {
          Timeline::makeShorter(&this->timeline,0x3c);
          goto LAB_0018c1c2;
        }
        break;
      case 0x109:
        if (event == 1) {
          iVar8 = Timeline::getMaxFrame(&this->timeline);
          if (iVar8 < 0x34bc0) {
            Timeline::makeLonger(&this->timeline,0x3c);
          }
          goto LAB_0018c1c2;
        }
      }
    }
  }
switchD_0018b9d2_caseD_3e:
  if ((event == 0) && (this->lastEventWasModKey != false)) {
    DynamicScene::XFormWidget::restoreLastMode(this->scene->elementTransform);
  }
LAB_0018c1c2:
  this->lastEventWasModKey = false;
  if ((mods != '\0') && (*(int *)&(this->super_Renderer).field_0xc != 2)) {
    this->lastEventWasModKey = true;
    if (mods == '\x04') {
      DynamicScene::XFormWidget::setRotate(this->scene->elementTransform);
    }
    else if (mods == '\x02') {
      DynamicScene::XFormWidget::setTranslate(this->scene->elementTransform);
    }
    else if (mods == '\x01') {
      DynamicScene::XFormWidget::setScale(this->scene->elementTransform);
    }
  }
  updateWidgets(this);
  return;
}

Assistant:

void Application::keyboard_event(int key, int event, unsigned char mods) {
  switch (mode) {
    case ANIMATE_MODE:
      switch (key) {
        case GLFW_KEY_TAB:
          if (event == GLFW_PRESS && action == Action::Object)
            scene->elementTransform->cycleMode();
          break;
        case GLFW_KEY_L:
          if (event == GLFW_PRESS) timeline.action_loop();
          break;
        case GLFW_KEY_I:
          if (event == GLFW_PRESS) {
            action = Action::IK;
            ikTargets.clear();
          }
          break;
        case GLFW_KEY_UP:
          // One hour of video max
          if (event == GLFW_PRESS && timeline.getMaxFrame() < 216000) {
            // Give them another second
            timeline.makeLonger(60);
          }
          break;
        case GLFW_KEY_DOWN:
          if (event == GLFW_PRESS) {
            timeline.makeShorter(60);
          }
          break;
        case GLFW_KEY_SPACE:
          if (event == GLFW_PRESS && (action != Action::Raytrace_Video &&
                                      action != Action::Rasterize_Video)) {
            if (timeline.isCurrentlyPlaying())
              timeline.action_stop();
            else {
              timeline.action_play();
              scene->removeObject(scene->elementTransform);
            }
            setGhosted(!timeline.isCurrentlyPlaying() &&
                       action != Action::Wave);
          }
          break;
        case GLFW_KEY_LEFT:
          switch (mods) {
            case GLFW_MOD_SHIFT:
              if (event == GLFW_PRESS) timeline.action_goto_prev_key_frame();
              break;
            case GLFW_MOD_CONTROL:
              timeline.action_rewind();
              break;
            case GLFW_MOD_ALT:
              if (event == GLFW_PRESS) timeline.action_step_backward(1);
              break;
            default:
              timeline.action_step_backward(1);
              break;
          }
          break;
        case GLFW_KEY_RIGHT:
          switch (mods) {
            case GLFW_MOD_SHIFT:
              if (event == GLFW_PRESS) timeline.action_goto_next_key_frame();
              break;
            case GLFW_MOD_CONTROL:
              timeline.action_goto_end();
              break;
            case GLFW_MOD_ALT:
              if (event == GLFW_PRESS) timeline.action_step_forward(1);
              break;
            default:
              timeline.action_step_forward(1);
              break;
          }
          break;
        case GLFW_KEY_BACKSPACE:
        case GLFW_KEY_DELETE:
          if (event == GLFW_PRESS && !timeline.isCurrentlyPlaying()) {
            if (mods) {
              timeline.unmarkTime(timeline.getCurrentFrame());
              for (auto o : scene->objects) {
                DynamicScene::Mesh *m = dynamic_cast<DynamicScene::Mesh *>(o);
                if (m) m->unkeyframe(timeline.getCurrentFrame());
              }
            } else {
              if (action == Action::CreateJoint) {
                scene->erase_selected_joint();
                clickedJoint = nullptr;
              } else if (scene->selected.object != nullptr) {
                double t = timeline.getCurrentFrame();
                DynamicScene::Mesh *m =
                    dynamic_cast<DynamicScene::Mesh *>(scene->selected.object);
                if (m) m->unkeyframe(t);

                /* Determine if there are any other objects with knots here
                       * so we can unmark the timeline. */
                bool remaining = false;
                for (auto o : scene->objects) {
                  double t = timeline.getCurrentFrame();
                  auto v = o->positions(t);
                  if (o->positions.removeKnot(t)) {
                    remaining = true;
                    o->positions.setValue(t, v);
                    break;
                  }
                }
                if (remaining == false)
                  timeline.unmarkTime(timeline.getCurrentFrame());
              }
            }
          }
          break;
        case GLFW_KEY_O:
          to_object_action();
          break;
        case GLFW_KEY_U:
          if (event == GLFW_PRESS) useCapsuleRadius = !useCapsuleRadius;
          break;
        case GLFW_KEY_W:
          to_wave_action();
          break;
        case GLFW_KEY_Z:
          for (auto o : scene->objects) {
            if (o->getInfo()[0][0] == 'M') {  // Mesh
              ((DynamicScene::Mesh *)o)->resetWave();
            }
          }
          break;
        case GLFW_KEY_N:
          if (event == GLFW_PRESS) raytrace_video();
          break;
        case GLFW_KEY_T:
          if (event == GLFW_PRESS) rasterize_video();
          break;
        case GLFW_KEY_D:
          if (event == GLFW_PRESS) action = Action::BoneRadius;
          break;
        case GLFW_KEY_EQUAL:
          if (!(mods & GLFW_MOD_ALT) ||
              (mods & GLFW_MOD_ALT && event == GLFW_PRESS)) {
            if (mods & GLFW_MOD_SHIFT) {
              damping_factor += 0.001;
              if (damping_factor > 1) damping_factor = 1.0;
            } else {
              timestep += 0.01;
            }
          }
          break;
        case GLFW_KEY_MINUS:
          if (!(mods & GLFW_MOD_ALT) ||
              (mods & GLFW_MOD_ALT && event == GLFW_PRESS)) {
            if (mods & GLFW_MOD_SHIFT) {
              damping_factor -= 0.001;
              if (damping_factor < 0.0) damping_factor = 0.0;
            } else {
              timestep -= 0.01;
              if (timestep < EPS_D) timestep = 0.01;
            }
          }
          break;
        case GLFW_KEY_F:
          if (event == GLFW_PRESS) {
            integrator = Integrator::Forward_Euler;
          }
          break;
        case GLFW_KEY_S:
          if (event == GLFW_PRESS) {
            integrator = Integrator::Symplectic_Euler;
          }
          break;
        case GLFW_KEY_K:
          if (event == GLFW_PRESS) {
            if (mods) {
              for (DynamicScene::SceneObject *o : scene->objects) {
                DynamicScene::Mesh *m = dynamic_cast<DynamicScene::Mesh *>(o);
                if (m) {
                  m->keyframe(timeline.getCurrentFrame());
                  timeline.markTime(timeline.getCurrentFrame());
                }
              }
            } else {
              DynamicScene::Mesh *m =
                  dynamic_cast<DynamicScene::Mesh *>(scene->selected.object);
              if (m) {
                m->keyframe(timeline.getCurrentFrame());
                timeline.markTime(timeline.getCurrentFrame());
              }
            }
          }
      }
      break;
    case RENDER_MODE:
      break;
    case VISUALIZE_MODE:
      break;
    case MODEL_MODE:
      switch (key) {
        case GLFW_KEY_BACKSPACE:
        case GLFW_KEY_DELETE:
          if (event == GLFW_PRESS) {
            scene->erase_selected_element();
          }
          break;
        case GLFW_KEY_TAB:
          if (event == GLFW_PRESS) {
            show_hud = !show_hud;
          }
          break;
        default:
          break;
      }
      break;
    default:
      break;
  }

  if (lastEventWasModKey && event == GLFW_RELEASE) {
    scene->elementTransform->restoreLastMode();
  }

  lastEventWasModKey = false;
  if (mods && mode != ANIMATE_MODE) {
    lastEventWasModKey = true;

    switch (mods) {
      case GLFW_MOD_SHIFT:
        scene->elementTransform->setScale();
        break;
      case GLFW_MOD_CONTROL:
        scene->elementTransform->setTranslate();
        break;
      case GLFW_MOD_ALT:
        scene->elementTransform->setRotate();
        break;
      default:
        break;
    }
  }

  updateWidgets();
}